

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O3

bool Am_Handle_Placeholders_And_Call_Command
               (int cnt,Am_Object *cmd,Am_Selective_Allowed_Method *same_allowed_method,
               Am_Handler_Selective_Undo_Method *same_method,
               Am_Selective_New_Allowed_Method *new_allowed_method,
               Am_Handler_Selective_Repeat_New_Method *new_method,Am_Object *sel_widget,
               Am_Object *undo_handler,Am_Object *new_cmd)

{
  Am_Selective_New_Allowed_Method_Type *pAVar1;
  Am_Handler_Selective_Repeat_New_Method_Type *pAVar2;
  Am_Selective_Allowed_Method_Type *pAVar3;
  Am_Handler_Selective_Undo_Method_Type *pAVar4;
  bool bVar5;
  size_t sVar6;
  ostream *poVar7;
  Am_Value *this;
  Am_Value *pAVar8;
  Am_Object *this_00;
  anon_union_8_8_ea4c8939_for_value new_value_00;
  Am_Value AVar9;
  Am_Value AVar10;
  Am_Value AVar11;
  Am_Value AVar12;
  Am_Value new_value;
  Am_String s;
  Am_Value orig_obj_modified;
  Am_Value orig_value;
  ostrstream oss_1;
  char line_1 [250];
  ostrstream oss;
  char line [300];
  bool local_62b;
  bool local_62a;
  bool local_629;
  Am_Value local_628;
  Am_Object local_618;
  Am_Value local_610;
  Am_Object local_600;
  Am_Object local_5f8;
  Am_Object local_5f0;
  Am_Object local_5e8;
  Am_Object local_5e0;
  Am_Object local_5d8;
  Am_Object local_5d0;
  Am_Object local_5c8;
  Am_Object local_5c0;
  Am_Object local_5b8;
  Am_Handler_Selective_Repeat_New_Method *local_5b0;
  Am_Value local_5a8;
  Am_Value local_598;
  Am_Handler_Selective_Undo_Method *local_588;
  Am_Value local_580;
  Am_Value local_570;
  Am_Value local_560;
  Am_Value local_550;
  Am_Object local_540 [45];
  char local_3d8 [264];
  ostrstream local_2d0 [360];
  char local_168 [312];
  
  Am_Beep_Happened = false;
  local_5b0 = new_method;
  local_588 = same_method;
  std::ostrstream::ostrstream(local_2d0,local_168,300,_S_out);
  reset_ostrstream(local_2d0);
  Am_Object::Am_Object(&local_5b8,cmd);
  am_write_command_name(&local_5b8,cnt,local_2d0);
  Am_Object::~Am_Object(&local_5b8);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Doing cmd: ",0xb);
    sVar6 = strlen(local_168);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_168,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," || ",4);
    poVar7 = operator<<((ostream *)&std::cout,cmd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::ostream::flush();
  }
  local_62b = false;
  local_629 = false;
  local_62a = false;
  local_5a8.type = 0;
  local_5a8.value.wrapper_value = (Am_Wrapper *)0x0;
  local_598.type = 0;
  local_598.value.wrapper_value = (Am_Wrapper *)0x0;
  local_628.type = 0;
  local_628.value.wrapper_value = (Am_Wrapper *)0x0;
  local_610.type = 0;
  local_610.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Am_Object(&local_5c0,&Am_Object_Create_Command);
  bVar5 = Am_Object::Is_Instance_Of(cmd,&local_5c0);
  Am_Object::~Am_Object(&local_5c0);
  if (bVar5) {
LAB_001f289b:
    Am_Object::Am_Object(&local_618,&Am_Object_Create_Command);
    bVar5 = Am_Object::Is_Instance_Of(cmd,&local_618);
    if (bVar5) {
      Am_Object::~Am_Object(&local_618);
LAB_001f2907:
      pAVar8 = &local_628;
      new_value_00.wrapper_value = (Am_Wrapper *)&local_610;
      bVar5 = Am_Replace_Create_Placeholders
                        (cmd,&local_629,sel_widget,pAVar8,(Am_Value *)new_value_00.wrapper_value);
    }
    else {
      Am_Object::Am_Object(&local_5c8,&Am_Find_Command);
      bVar5 = Am_Object::Is_Instance_Of(cmd,&local_5c8);
      Am_Object::~Am_Object(&local_5c8);
      Am_Object::~Am_Object(&local_618);
      if (bVar5) goto LAB_001f2907;
      bVar5 = Am_Replace_Placeholders(cmd,0x16d,&local_62b,&local_5a8,&local_628,sel_widget);
      if (!bVar5) goto LAB_001f2f7c;
      pAVar8 = &local_598;
      new_value_00.wrapper_value = (Am_Wrapper *)&local_610;
      new_method = (Am_Handler_Selective_Repeat_New_Method *)sel_widget;
      bVar5 = Am_Replace_Placeholders
                        (cmd,0x169,&local_62a,pAVar8,(Am_Value *)new_value_00.wrapper_value,
                         sel_widget);
    }
    if (bVar5 != false) {
      if (am_sdebug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"%% Going to call method on cmd ",0x1f);
        poVar7 = operator<<((ostream *)&std::cout,cmd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::ostream::flush();
      }
      this = Am_Object::Get(cmd,0xef,1);
      bVar5 = Am_Value::Valid(this);
      if (((local_62b != false) || (local_62a != false)) || (bVar5 || (local_629 & 1U) != 0)) {
        pAVar1 = new_allowed_method->Call;
        Am_Object::Am_Object(&local_5d0,cmd);
        Am_Value::Am_Value(&local_550,&local_628);
        Am_Value::Am_Value(&local_560,&local_610);
        AVar9.value.wrapper_value = (Am_Wrapper *)&local_560;
        AVar9._0_8_ = &local_550;
        AVar10.value.wrapper_value = new_value_00.wrapper_value;
        AVar10._0_8_ = pAVar8;
        bVar5 = (*pAVar1)((Am_Object_Data *)&local_5d0,AVar9,AVar10);
        Am_Value::~Am_Value(&local_560);
        Am_Value::~Am_Value(&local_550);
        Am_Object::~Am_Object(&local_5d0);
        if (!bVar5) {
          std::ostrstream::ostrstream((ostrstream *)local_540,local_3d8,0xfa,_S_out);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_540,"Can\'t execute command ",0x16);
          poVar7 = (ostream *)std::ostream::operator<<(local_540,cnt);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,". ",2);
          pAVar8 = Am_Object::Get(cmd,0x150,0);
          poVar7 = operator<<(poVar7,pAVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," on NEW objects  ",0x11);
          poVar7 = operator<<(poVar7,&local_628);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," with new value ",0x10);
          poVar7 = operator<<(poVar7,&local_610);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; command object ",0x11);
          poVar7 = operator<<(poVar7,cmd);
          std::ostream::put((char)poVar7);
          Am_Pop_Up_Error_Window(local_3d8);
LAB_001f2f6f:
          std::ostrstream::~ostrstream((ostrstream *)local_540);
          goto LAB_001f2f7c;
        }
        if (am_sdebug == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%% ",3);
          poVar7 = operator<<((ostream *)&std::cout,local_5b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," on ",4);
          poVar7 = operator<<(poVar7,cmd);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," new_obj ",9);
          poVar7 = operator<<(poVar7,&local_628);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," val ",5);
          poVar7 = operator<<(poVar7,&local_610);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::ostream::flush();
        }
        pAVar2 = local_5b0->Call;
        Am_Object::Am_Object(&local_5d8,undo_handler);
        Am_Object::Am_Object(&local_5e0,cmd);
        Am_Value::Am_Value(&local_570,&local_628);
        Am_Value::Am_Value(&local_580,&local_610);
        AVar11.value.wrapper_value = (Am_Wrapper *)&local_570;
        AVar11._0_8_ = &local_5e0;
        AVar12.value = (anon_union_8_8_ea4c8939_for_value)
                       (anon_union_8_8_ea4c8939_for_value)new_method;
        AVar12._0_8_ = &local_580;
        (*pAVar2)((Am_Object_Data *)local_540,(Am_Object_Data *)&local_5d8,AVar11,AVar12);
        Am_Object::operator=(new_cmd,local_540);
        Am_Object::~Am_Object(local_540);
        Am_Value::~Am_Value(&local_580);
        Am_Value::~Am_Value(&local_570);
        Am_Object::~Am_Object(&local_5e0);
        this_00 = &local_5d8;
      }
      else {
        pAVar3 = same_allowed_method->Call;
        Am_Object::Am_Object(&local_5e8,cmd);
        bVar5 = (*pAVar3)((Am_Object_Data *)&local_5e8);
        Am_Object::~Am_Object(&local_5e8);
        if (!bVar5) {
          std::ostrstream::ostrstream((ostrstream *)local_540,local_3d8,0xfa,_S_out);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_540,"Can\'t execute command ",0x16);
          poVar7 = (ostream *)std::ostream::operator<<(local_540,cnt);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,". ",2);
          pAVar8 = Am_Object::Get(cmd,0x150,0);
          poVar7 = operator<<(poVar7,pAVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," on SAME; command object ",0x19);
          poVar7 = operator<<(poVar7,cmd);
          std::ostream::put((char)poVar7);
          Am_Pop_Up_Error_Window(local_3d8);
          goto LAB_001f2f6f;
        }
        pAVar4 = local_588->Call;
        Am_Object::Am_Object(&local_5f0,undo_handler);
        Am_Object::Am_Object(&local_5f8,cmd);
        (*pAVar4)((Am_Object_Data *)local_540,(Am_Object_Data *)&local_5f0);
        Am_Object::operator=(new_cmd,local_540);
        Am_Object::~Am_Object(local_540);
        Am_Object::~Am_Object(&local_5f8);
        this_00 = &local_5f0;
      }
      Am_Object::~Am_Object(this_00);
      bVar5 = find_objects_for_placeholders
                        (Am_PLACEHOLDERS_SET_BY_THIS_COMMAND,cmd,new_cmd,sel_widget);
      if (bVar5) {
        bVar5 = true;
        if (Am_Beep_Happened != true) goto LAB_001f2f7e;
        am_gen_command_label(&local_600);
        std::ostrstream::ostrstream((ostrstream *)local_540,local_3d8,0xfa,_S_out);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_540,"Quitting due to Beep from command ",0x22);
        poVar7 = operator<<((ostream *)local_540,(Am_String *)&local_600);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; command object ",0x11);
        poVar7 = operator<<(poVar7,cmd);
        std::ostream::put((char)poVar7);
        Am_Pop_Up_Error_Window(local_3d8);
        std::ostrstream::~ostrstream((ostrstream *)local_540);
        Am_String::~Am_String((Am_String *)&local_600);
      }
    }
  }
  else {
    new_method = (Am_Handler_Selective_Repeat_New_Method *)sel_widget;
    bVar5 = Am_Replace_Placeholders(cmd,0x16d,&local_62b,&local_5a8,&local_628,sel_widget);
    if (bVar5) goto LAB_001f289b;
  }
LAB_001f2f7c:
  bVar5 = false;
LAB_001f2f7e:
  Am_Value::~Am_Value(&local_610);
  Am_Value::~Am_Value(&local_628);
  Am_Value::~Am_Value(&local_598);
  Am_Value::~Am_Value(&local_5a8);
  std::ostrstream::~ostrstream(local_2d0);
  return bVar5;
}

Assistant:

bool
Am_Handle_Placeholders_And_Call_Command(
    int cnt, Am_Object &cmd, Am_Selective_Allowed_Method &same_allowed_method,
    Am_Handler_Selective_Undo_Method &same_method,
    Am_Selective_New_Allowed_Method &new_allowed_method,
    Am_Handler_Selective_Repeat_New_Method &new_method, Am_Object &sel_widget,
    Am_Object &undo_handler, Am_Object &new_cmd)
{
  char line[300];

  Am_Beep_Happened = false; //global in opal_advanced.h

  OSTRSTREAM_CONSTR(oss, line, 300, std::ios::out);
  reset_ostrstream(oss); // go to the beginning
  am_write_command_name(cmd, cnt, oss);
  OSTRSTREAM_COPY(oss, line, 300);
  if (am_sdebug)
    std::cout << "Doing cmd: " << line << " || " << cmd << std::endl
              << std::flush;

  bool replaced_obj_mod = false;
  bool replaced_create = false;
  bool replaced_value = false;
  Am_Value orig_obj_modified, orig_value, new_obj_mod, new_value;
  bool ok;

  if (!cmd.Is_Instance_Of(Am_Object_Create_Command)) {
    ok = Am_Replace_Placeholders(cmd, Am_OBJECT_MODIFIED, replaced_obj_mod,
                                 orig_obj_modified, new_obj_mod, sel_widget);
    if (!ok)
      return false;
  }
  if (cmd.Is_Instance_Of(Am_Object_Create_Command) ||
      cmd.Is_Instance_Of(Am_Find_Command)) {
    ok = Am_Replace_Create_Placeholders(cmd, replaced_create, sel_widget,
                                        new_obj_mod, new_value);
    if (!ok) {
      return false;
    }
  } else {
    ok = Am_Replace_Placeholders(cmd, Am_OBJECT_MODIFIED, replaced_obj_mod,
                                 orig_obj_modified, new_obj_mod, sel_widget);
    if (!ok)
      return false;
    ok = Am_Replace_Placeholders(cmd, Am_VALUE, replaced_value, orig_value,
                                 new_value, sel_widget);
    if (!ok) {
      return false;
    }
  }

  if (am_sdebug)
    std::cout << "%% Going to call method on cmd " << cmd << std::endl
              << std::flush;

  bool selectdir = cmd.Peek(Am_CURRENT_DIRECTION).Valid(); //HACK

  if (replaced_obj_mod || replaced_value || replaced_create || selectdir) {
    if (!new_allowed_method.Call(cmd, new_obj_mod, new_value)) {
      AM_POP_UP_ERROR_WINDOW("Can't execute command "
                             << cnt << ". " << cmd.Get(Am_LABEL)
                             << " on NEW objects  " << new_obj_mod
                             << " with new value " << new_value
                             << "; command object " << cmd);
      return false;
    }
    if (am_sdebug)
      std::cout << "%% " << new_method << " on " << cmd << " new_obj "
                << new_obj_mod << " val " << new_value << std::endl
                << std::flush;
    new_cmd = new_method.Call(undo_handler, cmd, new_obj_mod, new_value);
  } else { // not on new objects
    if (!same_allowed_method.Call(cmd)) {
      AM_POP_UP_ERROR_WINDOW("Can't execute command "
                             << cnt << ". " << cmd.Get(Am_LABEL)
                             << " on SAME; command object " << cmd);
      return false;
    }
    new_cmd = same_method.Call(undo_handler, cmd);
  }

  if (!find_objects_for_placeholders(Am_PLACEHOLDERS_SET_BY_THIS_COMMAND, cmd,
                                     new_cmd, sel_widget)) {
    return false;
  }
  if (Am_Beep_Happened) {
    Am_String s = am_gen_command_label(cmd);
    AM_POP_UP_ERROR_WINDOW("Quitting due to Beep from command "
                           << s << "; command object " << cmd);
    return false;
  }
  return true;
}